

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,unsigned_long *args_2)

{
  group_type_pointer pgVar1;
  uint uVar2;
  ushort uVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  group_type_pointer pgVar9;
  undefined1 auVar10 [16];
  
  pgVar7 = __return_storage_ptr__->pg;
  uVar5 = (ulong)__return_storage_ptr__->n;
  ppVar8 = __return_storage_ptr__->p;
  lVar6 = 1;
  while( true ) {
    pgVar9 = arrays_->groups_ + pos0;
    pgVar1 = arrays_->groups_ + pos0;
    auVar10[0] = -(pgVar1->m[0].n == '\0');
    auVar10[1] = -(pgVar1->m[1].n == '\0');
    auVar10[2] = -(pgVar1->m[2].n == '\0');
    auVar10[3] = -(pgVar1->m[3].n == '\0');
    auVar10[4] = -(pgVar1->m[4].n == '\0');
    auVar10[5] = -(pgVar1->m[5].n == '\0');
    auVar10[6] = -(pgVar1->m[6].n == '\0');
    auVar10[7] = -(pgVar1->m[7].n == '\0');
    auVar10[8] = -(pgVar1->m[8].n == '\0');
    auVar10[9] = -(pgVar1->m[9].n == '\0');
    auVar10[10] = -(pgVar1->m[10].n == '\0');
    auVar10[0xb] = -(pgVar1->m[0xb].n == '\0');
    auVar10[0xc] = -(pgVar1->m[0xc].n == '\0');
    auVar10[0xd] = -(pgVar1->m[0xd].n == '\0');
    auVar10[0xe] = -(pgVar1->m[0xe].n == '\0');
    auVar10[0xf] = -(pgVar1->m[0xf].n == '\0');
    uVar3 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
    if (uVar3 == 0) {
      pgVar9->m[0xf].n = pgVar9->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar2 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar5 = (ulong)uVar2;
      ppVar8 = arrays_->elements_ + pos0 * 0xf + uVar5;
      pcVar4 = args_1->_M_str;
      (ppVar8->first)._M_len = args_1->_M_len;
      (ppVar8->first)._M_str = pcVar4;
      ppVar8->second = *args_2;
      pgVar9->m[uVar5].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar7 = pgVar9;
    }
    if (uVar3 != 0) break;
    pos0 = pos0 + lVar6 & arrays_->groups_size_mask;
    lVar6 = lVar6 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar5;
  __return_storage_ptr__->p = ppVar8;
  __return_storage_ptr__->pg = pgVar7;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }